

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaJf.c
# Opt level: O1

Gia_Man_t * Jf_ManPerformMapping(Gia_Man_t *pGia,Jf_Par_t *pPars)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Jf_Par_t *pJVar4;
  Vec_Mem_t *pVVar5;
  char *pcVar6;
  word *pwVar7;
  bool bVar8;
  Jf_Man_t *p;
  FILE *__stream;
  code *pcVar9;
  char *pcVar10;
  uint uVar11;
  uint uVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  char pFileName [1000];
  char local_418 [1000];
  
  if (pGia->nBufs != 0) {
    __assert_fail("!Gia_ManBufNum(pGia)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x6b5,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (((pPars->fCutMin != 0) && (pPars->fFuncDsd != 0)) && (6 < pPars->nLutSize)) {
    __assert_fail("!pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/giaJf.c"
                  ,0x6b6,"Gia_Man_t *Jf_ManPerformMapping(Gia_Man_t *, Jf_Par_t *)");
  }
  if (pPars->fGenCnf != 0) {
    pPars->fCutMin = 1;
    pPars->fFuncDsd = 1;
    pPars->fOptEdge = 0;
  }
  if ((pPars->fCutMin != 0) && (pPars->fFuncDsd == 0)) {
    pPars->fCoarsen = 0;
  }
  p = Jf_ManAlloc(pGia,pPars);
  pcVar9 = Jf_CutCompareArea;
  if (pPars->fAreaOnly == 0) {
    pcVar9 = Jf_CutCompareDelay;
  }
  p->pCutCmp = pcVar9;
  iVar13 = 0;
  Jf_ManComputeCuts(p,0);
  Jf_ManComputeRefs(p);
  Jf_ManPrintStats(p,"Start");
  if (0 < pPars->nRounds) {
    pJVar4 = p->pPars;
    do {
      if (pJVar4->fGenCnf == 0) {
        Jf_ManPropagateFlow(p,pPars->fOptEdge);
        Jf_ManPrintStats(p,"Flow ");
      }
      Jf_ManPropagateEla(p,0);
      Jf_ManPrintStats(p,"Area ");
      Jf_ManPropagateEla(p,1);
      Jf_ManPrintStats(p,"Edge ");
      iVar13 = iVar13 + 1;
    } while (iVar13 < pPars->nRounds);
  }
  pJVar4 = p->pPars;
  if (((pJVar4->fVeryVerbose != 0) && (pJVar4->fCutMin != 0)) && (pJVar4->fFuncDsd == 0)) {
    pVVar5 = p->vTtMem;
    pcVar6 = p->pGia->pName;
    uVar1 = pJVar4->nLutSize;
    sprintf(local_418,"tt_%s_%02d.txt",pcVar6);
    __stream = _stdout;
    if (pcVar6 != (char *)0x0) {
      __stream = fopen(local_418,"wb");
    }
    if (_stdout == __stream) {
      printf("Memory vector has %d entries: \n",(ulong)(uint)pVVar5->nEntries);
    }
    if (0 < pVVar5->nEntries) {
      uVar12 = 0;
      do {
        pwVar7 = pVVar5->ppPages[uVar12 >> ((byte)pVVar5->LogPageSze & 0x1f)];
        if (pwVar7 == (word *)0x0) break;
        uVar2 = pVVar5->nEntrySize;
        if (0 < (int)uVar2) {
          uVar3 = pVVar5->PageMask;
          uVar14 = (ulong)uVar2;
          do {
            lVar15 = 0x3c;
            do {
              uVar11 = (uint)(pwVar7[(long)(int)((uVar3 & uVar12) * uVar2) + (uVar14 - 1)] >>
                             ((byte)lVar15 & 0x3f)) & 0xf;
              if (uVar11 < 10) {
                fprintf(__stream,"%d");
              }
              else {
                fputc(uVar11 + 0x37,__stream);
              }
              lVar15 = lVar15 + -4;
            } while (lVar15 != -4);
            bVar8 = 1 < (long)uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar8);
        }
        fputc(10,__stream);
        uVar12 = uVar12 + 1;
      } while ((int)uVar12 < pVVar5->nEntries);
    }
    if (__stream != _stdout) {
      fclose(__stream);
    }
    pcVar10 = local_418;
    if (pcVar6 == (char *)0x0) {
      pcVar10 = "stdout";
    }
    printf("Dumped %d %d-var truth tables into file \"%s\" (%.2f MB).\n",
           (double)pVVar5->nEntrySize * (double)pVVar5->nEntries * 8.0 * 9.5367431640625e-07,
           (ulong)(uint)pVVar5->nEntries,(ulong)uVar1,pcVar10);
  }
  if (pJVar4->fPureAig == 0) {
    if (pJVar4->fCutMin == 0) {
      Jf_ManDeriveMapping(p);
    }
    else {
      pGia = Jf_ManDeriveMappingGia(p);
    }
  }
  else {
    pGia = Jf_ManDeriveGia(p);
  }
  Jf_ManFree(p);
  return pGia;
}

Assistant:

Gia_Man_t * Jf_ManPerformMapping( Gia_Man_t * pGia, Jf_Par_t * pPars )
{
    Gia_Man_t * pNew = pGia;
    Jf_Man_t * p; int i;
    assert( !Gia_ManBufNum(pGia) );
    assert( !pPars->fCutMin || !pPars->fFuncDsd || pPars->nLutSize <= 6 );
    if ( pPars->fGenCnf )
        pPars->fCutMin = 1, pPars->fFuncDsd = 1, pPars->fOptEdge = 0;
    if ( pPars->fCutMin && !pPars->fFuncDsd )
        pPars->fCoarsen = 0;
    p = Jf_ManAlloc( pGia, pPars );
    p->pCutCmp = pPars->fAreaOnly ? Jf_CutCompareArea : Jf_CutCompareDelay;
    Jf_ManComputeCuts( p, 0 );
    Jf_ManComputeRefs( p );                         Jf_ManPrintStats( p, "Start" );
    for ( i = 0; i < pPars->nRounds; i++ )
    {
        if ( !p->pPars->fGenCnf )
        {
        Jf_ManPropagateFlow( p, pPars->fOptEdge );  Jf_ManPrintStats( p, "Flow " );
        }
        Jf_ManPropagateEla( p, 0 );                 Jf_ManPrintStats( p, "Area " );
        Jf_ManPropagateEla( p, 1 );                 Jf_ManPrintStats( p, "Edge " );
    }
    if ( p->pPars->fVeryVerbose && p->pPars->fCutMin && !p->pPars->fFuncDsd )
        Vec_MemDumpTruthTables( p->vTtMem, Gia_ManName(p->pGia), p->pPars->nLutSize );
    if ( p->pPars->fPureAig )
        pNew = Jf_ManDeriveGia(p);
    else if ( p->pPars->fCutMin )
        pNew = Jf_ManDeriveMappingGia(p);
    else
        Jf_ManDeriveMapping(p);
    Jf_ManFree( p );
    return pNew;
}